

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O0

_Bool readInstruction16(uint8_t *code,size_t code_len,uint16_t *insn)

{
  uint16_t *insn_local;
  size_t code_len_local;
  uint8_t *code_local;
  
  if (1 < code_len) {
    *insn = *(uint16_t *)code;
  }
  return 1 < code_len;
}

Assistant:

static bool readInstruction16(const uint8_t *code, size_t code_len, uint16_t *insn)
{
	if (code_len < 2)
		// insufficient data
		return false;

	// Encoded as a little-endian 16-bit word in the stream.
	*insn = (code[0] <<  0) | (code[1] <<  8);
	return true;
}